

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
libcellml::Parser::ParserImpl::loadVariable(ParserImpl *this,VariablePtr *variable,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  element_type *peVar2;
  Variable *pVVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  ulong *puVar9;
  byte bVar10;
  InterfaceType interfaceType;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  ulong uVar13;
  uint uVar14;
  string textNode;
  XmlAttributePtr attribute;
  IssuePtr issue_3;
  XmlNodePtr childNode;
  IssuePtr issue_2;
  string local_138;
  string local_118;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  IssuePtr local_d8;
  string local_c8;
  string local_a8;
  string local_88;
  XmlNodePtr *local_68;
  XmlNode local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  uint local_4c;
  undefined8 local_48;
  IssuePtr local_40;
  
  local_68 = node;
  XmlNode::firstChild(&local_60);
  while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_60.mPimpl !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) {
    bVar4 = XmlNode::isText((XmlNode *)local_60.mPimpl);
    if (bVar4) {
      XmlNode::convertToString_abi_cxx11_(&local_138,(XmlNode *)local_60.mPimpl);
      bVar4 = hasNonWhitespaceCharacters(&local_138);
      if (bVar4) {
        Issue::IssueImpl::create();
        pIVar1 = (IssueImpl *)
                 ((XmlNode *)
                 ((long)local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 8))->mPimpl;
        XmlNode::attribute_abi_cxx11_
                  (&local_a8,
                   (local_68->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,"name");
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x28fa35);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_88.field_2._M_allocated_capacity = *psVar8;
          local_88.field_2._8_8_ = plVar5[3];
        }
        else {
          local_88.field_2._M_allocated_capacity = *psVar8;
          local_88._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_88._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_c8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_c8,(ulong)local_138._M_dataplus._M_p);
        local_f8 = &local_e8;
        puVar9 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar9) {
          local_e8 = *puVar9;
          lStack_e0 = plVar5[3];
        }
        else {
          local_e8 = *puVar9;
          local_f8 = (ulong *)*plVar5;
        }
        local_f0 = plVar5[1];
        *plVar5 = (long)puVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 == paVar7) {
          local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_118.field_2._8_8_ = puVar6[3];
        }
        else {
          local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_118._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_118._M_string_length = puVar6[1];
        *puVar6 = paVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        Issue::IssueImpl::setDescription(pIVar1,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          (ulong)(local_118.field_2._M_allocated_capacity + 1));
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setVariable
                  ((AnyCellmlElementImpl *)
                   (((XmlNode *)
                    ((long)local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 8))->mPimpl[5].mXmlNodePtr)->_private,variable);
        Issue::IssueImpl::setReferenceRule
                  ((IssueImpl *)
                   ((XmlNode *)
                   ((long)local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 8))->mPimpl,XML_UNEXPECTED_CHARACTER);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_d8);
        if (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        (ulong)(local_138.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      bVar4 = XmlNode::isComment((XmlNode *)local_60.mPimpl);
      if (!bVar4) {
        Issue::IssueImpl::create();
        pIVar1 = (IssueImpl *)
                 ((XmlNode *)
                 ((long)local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 8))->mPimpl;
        if (this->mParsing1XVersion == true) {
          XmlNode::attribute_abi_cxx11_
                    (&local_88,
                     (local_68->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,"name");
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x28fa35);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8.field_2._8_8_ = plVar5[3];
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_c8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_f8 = &local_e8;
          puVar9 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar9) {
            local_e8 = *puVar9;
            lStack_e0 = plVar5[3];
          }
          else {
            local_e8 = *puVar9;
            local_f8 = (ulong *)*plVar5;
          }
          local_f0 = plVar5[1];
          *plVar5 = (long)puVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          XmlNode::name_abi_cxx11_(&local_a8,(XmlNode *)local_60.mPimpl);
          uVar13 = 0xf;
          if (local_f8 != &local_e8) {
            uVar13 = local_e8;
          }
          if (uVar13 < local_a8._M_string_length + local_f0) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              uVar11 = local_a8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_a8._M_string_length + local_f0) goto LAB_0023c6e9;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_f8);
          }
          else {
LAB_0023c6e9:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)local_a8._M_dataplus._M_p);
          }
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 == paVar7) {
            local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_118.field_2._8_8_ = puVar6[3];
          }
          else {
            local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_118._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_118._M_string_length = puVar6[1];
          *puVar6 = paVar7;
          puVar6[1] = 0;
          paVar7->_M_local_buf[0] = '\0';
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 == paVar7) {
            local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_138.field_2._8_8_ = puVar6[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_138._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_138._M_string_length = puVar6[1];
          *puVar6 = paVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar1,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,
                            (ulong)(local_138.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,
                            (ulong)(local_118.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,local_e8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          Issue::IssueImpl::setLevel
                    ((IssueImpl *)
                     ((XmlNode *)
                     ((long)local_d8.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     + 8))->mPimpl,MESSAGE);
        }
        else {
          XmlNode::attribute_abi_cxx11_
                    (&local_88,
                     (local_68->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,"name");
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x28fa35);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8.field_2._8_8_ = plVar5[3];
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_c8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_f8 = &local_e8;
          puVar9 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar9) {
            local_e8 = *puVar9;
            lStack_e0 = plVar5[3];
          }
          else {
            local_e8 = *puVar9;
            local_f8 = (ulong *)*plVar5;
          }
          local_f0 = plVar5[1];
          *plVar5 = (long)puVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          XmlNode::name_abi_cxx11_(&local_a8,(XmlNode *)local_60.mPimpl);
          uVar13 = 0xf;
          if (local_f8 != &local_e8) {
            uVar13 = local_e8;
          }
          if (uVar13 < local_a8._M_string_length + local_f0) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              uVar11 = local_a8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_a8._M_string_length + local_f0) goto LAB_0023c785;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_f8);
          }
          else {
LAB_0023c785:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)local_a8._M_dataplus._M_p);
          }
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 == paVar7) {
            local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_118.field_2._8_8_ = puVar6[3];
          }
          else {
            local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_118._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_118._M_string_length = puVar6[1];
          *puVar6 = paVar7;
          puVar6[1] = 0;
          paVar7->_M_local_buf[0] = '\0';
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 == paVar7) {
            local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_138.field_2._8_8_ = puVar6[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_138._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_138._M_string_length = puVar6[1];
          *puVar6 = paVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar1,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,
                            (ulong)(local_138.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,
                            (ulong)(local_118.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,local_e8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          Issue::IssueImpl::setReferenceRule
                    ((IssueImpl *)
                     ((XmlNode *)
                     ((long)local_d8.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     + 8))->mPimpl,XML_UNEXPECTED_ELEMENT);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setVariable
                  ((AnyCellmlElementImpl *)
                   (((XmlNode *)
                    ((long)local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 8))->mPimpl[5].mXmlNodePtr)->_private,variable);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_d8);
        if (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
    }
    XmlNode::next((XmlNode *)&local_138);
    this_01 = local_58;
    local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length;
    local_60.mPimpl = (XmlNodeImpl *)local_138._M_dataplus._M_p;
    local_138._M_dataplus._M_p = (pointer)0x0;
    local_138._M_string_length = 0;
    if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
    }
  }
  XmlNode::firstAttribute((XmlNode *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar10 = 0;
    uVar14 = 0;
  }
  else {
    local_48 = 0;
    local_4c = 0;
    do {
      bVar4 = XmlAttribute::isType
                        ((XmlAttribute *)
                         local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"name","");
      if (bVar4) {
        peVar2 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        XmlAttribute::value_abi_cxx11_
                  (&local_138,
                   (XmlAttribute *)
                   local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
        NamedEntity::setName(&peVar2->super_NamedEntity,&local_138);
        paVar7 = &local_138.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar7) {
          operator_delete(local_138._M_dataplus._M_p,
                          (ulong)(local_138.field_2._M_allocated_capacity + 1));
          paVar7 = extraout_RAX;
        }
        local_4c = (uint)CONCAT71((int7)((ulong)paVar7 >> 8),1);
      }
      else {
        bVar4 = isIdAttribute((XmlAttributePtr *)&local_d8,this->mParsing1XVersion);
        if (bVar4) {
          peVar2 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          XmlAttribute::value_abi_cxx11_
                    (&local_138,
                     (XmlAttribute *)
                     local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          Entity::setId((Entity *)peVar2,&local_138);
          goto LAB_0023cc18;
        }
        bVar4 = XmlAttribute::isType
                          ((XmlAttribute *)
                           local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,"units","");
        if (bVar4) {
          pVVar3 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (this->mParsing1XVersion == true) {
            XmlAttribute::value_abi_cxx11_
                      (&local_118,
                       (XmlAttribute *)
                       local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            convertNonSiUnits(&local_138,&local_118);
            Variable::setUnits(pVVar3,&local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,
                              (ulong)(local_138.field_2._M_allocated_capacity + 1));
            }
            paVar7 = &local_118.field_2;
            uVar11 = local_118.field_2._M_allocated_capacity;
            _Var12._M_p = local_118._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar7) {
LAB_0023cd21:
              operator_delete(_Var12._M_p,(ulong)((long)&((XmlNodeImpl *)uVar11)->mXmlNodePtr + 1));
              paVar7 = extraout_RAX_00;
            }
          }
          else {
            XmlAttribute::value_abi_cxx11_
                      (&local_138,
                       (XmlAttribute *)
                       local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            Variable::setUnits(pVVar3,&local_138);
            paVar7 = &local_138.field_2;
            uVar11 = local_138.field_2._M_allocated_capacity;
            _Var12._M_p = local_138._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != paVar7) goto LAB_0023cd21;
          }
          local_48 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
          goto LAB_0023cd33;
        }
        bVar4 = XmlAttribute::isType
                          ((XmlAttribute *)
                           local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,"interface","");
        if (bVar4) {
          pVVar3 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          XmlAttribute::value_abi_cxx11_
                    (&local_138,
                     (XmlAttribute *)
                     local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          Variable::setInterfaceType(pVVar3,&local_138);
        }
        else {
          bVar4 = XmlAttribute::isType
                            ((XmlAttribute *)
                             local_d8.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             ,"initial_value","");
          if (!bVar4) {
            bVar10 = this->mParsing1XVersion;
            if ((bool)bVar10 == true) {
              bVar4 = XmlAttribute::isType
                                ((XmlAttribute *)
                                 local_d8.
                                 super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,"public_interface","");
              if (!bVar4) {
                bVar10 = this->mParsing1XVersion;
                goto LAB_0023cdfd;
              }
              bVar4 = Variable::hasInterfaceType
                                ((variable->
                                 super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr,PRIVATE);
              interfaceType = bVar4 | PUBLIC;
            }
            else {
LAB_0023cdfd:
              if (((bVar10 & 1) == 0) ||
                 (bVar4 = XmlAttribute::isType
                                    ((XmlAttribute *)
                                     local_d8.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,"private_interface",""), !bVar4)) {
                Issue::IssueImpl::create();
                pIVar1 = (local_40.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl;
                if (this->mParsing1XVersion == true) {
                  XmlNode::attribute_abi_cxx11_
                            (&local_88,
                             (local_68->
                             super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,"name");
                  plVar5 = (long *)std::__cxx11::string::replace
                                             ((ulong)&local_88,0,(char *)0x0,0x28fa35);
                  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                  psVar8 = (size_type *)(plVar5 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar5 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar8) {
                    local_c8.field_2._M_allocated_capacity = *psVar8;
                    local_c8.field_2._8_8_ = plVar5[3];
                  }
                  else {
                    local_c8.field_2._M_allocated_capacity = *psVar8;
                    local_c8._M_dataplus._M_p = (pointer)*plVar5;
                  }
                  local_c8._M_string_length = plVar5[1];
                  *plVar5 = (long)psVar8;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
                  local_f8 = &local_e8;
                  puVar9 = (ulong *)(plVar5 + 2);
                  if ((ulong *)*plVar5 == puVar9) {
                    local_e8 = *puVar9;
                    lStack_e0 = plVar5[3];
                  }
                  else {
                    local_e8 = *puVar9;
                    local_f8 = (ulong *)*plVar5;
                  }
                  local_f0 = plVar5[1];
                  *plVar5 = (long)puVar9;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  XmlAttribute::name_abi_cxx11_
                            (&local_a8,
                             (XmlAttribute *)
                             local_d8.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            );
                  uVar13 = 0xf;
                  if (local_f8 != &local_e8) {
                    uVar13 = local_e8;
                  }
                  if (uVar13 < local_a8._M_string_length + local_f0) {
                    uVar11 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                      uVar11 = local_a8.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar11 < local_a8._M_string_length + local_f0) goto LAB_0023d06d;
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_a8,0,(char *)0x0,(ulong)local_f8);
                  }
                  else {
LAB_0023d06d:
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_f8,(ulong)local_a8._M_dataplus._M_p);
                  }
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(puVar6 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 == paVar7) {
                    local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                    local_118.field_2._8_8_ = puVar6[3];
                  }
                  else {
                    local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                    local_118._M_dataplus._M_p = (pointer)*puVar6;
                  }
                  local_118._M_string_length = puVar6[1];
                  *puVar6 = paVar7;
                  puVar6[1] = 0;
                  paVar7->_M_local_buf[0] = '\0';
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
                  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(puVar6 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 == paVar7) {
                    local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                    local_138.field_2._8_8_ = puVar6[3];
                  }
                  else {
                    local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                    local_138._M_dataplus._M_p = (pointer)*puVar6;
                  }
                  local_138._M_string_length = puVar6[1];
                  *puVar6 = paVar7;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  Issue::IssueImpl::setDescription(pIVar1,&local_138);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                    operator_delete(local_138._M_dataplus._M_p,
                                    (ulong)(local_138.field_2._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p,
                                    (ulong)(local_118.field_2._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                    operator_delete(local_a8._M_dataplus._M_p,
                                    local_a8.field_2._M_allocated_capacity + 1);
                  }
                  if (local_f8 != &local_e8) {
                    operator_delete(local_f8,local_e8 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                    operator_delete(local_c8._M_dataplus._M_p,
                                    local_c8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) {
                    operator_delete(local_88._M_dataplus._M_p,
                                    local_88.field_2._M_allocated_capacity + 1);
                  }
                  Issue::IssueImpl::setLevel
                            ((local_40.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl,MESSAGE);
                }
                else {
                  XmlNode::attribute_abi_cxx11_
                            (&local_88,
                             (local_68->
                             super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,"name");
                  plVar5 = (long *)std::__cxx11::string::replace
                                             ((ulong)&local_88,0,(char *)0x0,0x28fa35);
                  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                  psVar8 = (size_type *)(plVar5 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar5 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar8) {
                    local_c8.field_2._M_allocated_capacity = *psVar8;
                    local_c8.field_2._8_8_ = plVar5[3];
                  }
                  else {
                    local_c8.field_2._M_allocated_capacity = *psVar8;
                    local_c8._M_dataplus._M_p = (pointer)*plVar5;
                  }
                  local_c8._M_string_length = plVar5[1];
                  *plVar5 = (long)psVar8;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
                  local_f8 = &local_e8;
                  puVar9 = (ulong *)(plVar5 + 2);
                  if ((ulong *)*plVar5 == puVar9) {
                    local_e8 = *puVar9;
                    lStack_e0 = plVar5[3];
                  }
                  else {
                    local_e8 = *puVar9;
                    local_f8 = (ulong *)*plVar5;
                  }
                  local_f0 = plVar5[1];
                  *plVar5 = (long)puVar9;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  XmlAttribute::name_abi_cxx11_
                            (&local_a8,
                             (XmlAttribute *)
                             local_d8.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            );
                  uVar13 = 0xf;
                  if (local_f8 != &local_e8) {
                    uVar13 = local_e8;
                  }
                  if (uVar13 < local_a8._M_string_length + local_f0) {
                    uVar11 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                      uVar11 = local_a8.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar11 < local_a8._M_string_length + local_f0) goto LAB_0023d106;
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_a8,0,(char *)0x0,(ulong)local_f8);
                  }
                  else {
LAB_0023d106:
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_f8,(ulong)local_a8._M_dataplus._M_p);
                  }
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(puVar6 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 == paVar7) {
                    local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                    local_118.field_2._8_8_ = puVar6[3];
                  }
                  else {
                    local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                    local_118._M_dataplus._M_p = (pointer)*puVar6;
                  }
                  local_118._M_string_length = puVar6[1];
                  *puVar6 = paVar7;
                  puVar6[1] = 0;
                  paVar7->_M_local_buf[0] = '\0';
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
                  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(puVar6 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 == paVar7) {
                    local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                    local_138.field_2._8_8_ = puVar6[3];
                  }
                  else {
                    local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                    local_138._M_dataplus._M_p = (pointer)*puVar6;
                  }
                  local_138._M_string_length = puVar6[1];
                  *puVar6 = paVar7;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  Issue::IssueImpl::setDescription(pIVar1,&local_138);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                    operator_delete(local_138._M_dataplus._M_p,
                                    (ulong)(local_138.field_2._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p,
                                    (ulong)(local_118.field_2._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                    operator_delete(local_a8._M_dataplus._M_p,
                                    local_a8.field_2._M_allocated_capacity + 1);
                  }
                  if (local_f8 != &local_e8) {
                    operator_delete(local_f8,local_e8 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                    operator_delete(local_c8._M_dataplus._M_p,
                                    local_c8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) {
                    operator_delete(local_88._M_dataplus._M_p,
                                    local_88.field_2._M_allocated_capacity + 1);
                  }
                  Issue::IssueImpl::setReferenceRule
                            ((local_40.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl,VARIABLE_ATTRIBUTE_OPTIONAL);
                }
                AnyCellmlElement::AnyCellmlElementImpl::setVariable
                          ((((local_40.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl->mItem).
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,variable);
                Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_40);
                if (local_40.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_40.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                goto LAB_0023cd33;
              }
              bVar4 = Variable::hasInterfaceType
                                ((variable->
                                 super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr,PUBLIC);
              interfaceType = (uint)bVar4 * 2 + PRIVATE;
            }
            Variable::setInterfaceType
                      ((variable->
                       super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                       interfaceType);
            goto LAB_0023cd33;
          }
          pVVar3 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          XmlAttribute::value_abi_cxx11_
                    (&local_138,
                     (XmlAttribute *)
                     local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          Variable::setInitialValue(pVVar3,&local_138);
        }
LAB_0023cc18:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          (ulong)(local_138.field_2._M_allocated_capacity + 1));
        }
      }
LAB_0023cd33:
      XmlAttribute::next((XmlAttribute *)&local_138);
      this_00._M_pi =
           local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length;
      local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_138._M_dataplus._M_p;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
    if (((byte)local_4c & (byte)local_48 & 1) != 0) goto LAB_0023d7a5;
    bVar10 = ((byte)local_4c ^ 1) & (byte)local_48;
    uVar14 = local_4c;
  }
  Issue::IssueImpl::create();
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Variable ","");
  if ((uVar14 & 1) == 0) {
    if ((bVar10 & 1) != 0) {
      XmlNode::attribute_abi_cxx11_
                (&local_c8,
                 (local_68->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,"units");
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x2a67c7);
      local_f8 = &local_e8;
      puVar9 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar9) {
        local_e8 = *puVar9;
        lStack_e0 = puVar6[3];
      }
      else {
        local_e8 = *puVar9;
        local_f8 = (ulong *)*puVar6;
      }
      local_f0 = puVar6[1];
      *puVar6 = puVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar7) {
        local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_118.field_2._8_8_ = puVar6[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_118._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_118._M_string_length = puVar6[1];
      *puVar6 = paVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_118._M_dataplus._M_p);
      goto LAB_0023d6d9;
    }
    std::__cxx11::string::append((char *)&local_138);
  }
  else {
    XmlNode::attribute_abi_cxx11_
              (&local_c8,
               (local_68->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               ,"name");
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x2a80f6);
    local_f8 = &local_e8;
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_e8 = *puVar9;
      lStack_e0 = plVar5[3];
    }
    else {
      local_e8 = *puVar9;
      local_f8 = (ulong *)*plVar5;
    }
    local_f0 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar7) {
      local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_118.field_2._8_8_ = puVar6[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_118._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_118._M_string_length = puVar6[1];
    *puVar6 = paVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_118._M_dataplus._M_p);
LAB_0023d6d9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      (ulong)(local_118.field_2._M_allocated_capacity + 1));
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  Issue::IssueImpl::setDescription(*(IssueImpl **)(local_88._M_dataplus._M_p + 8),&local_138);
  Issue::IssueImpl::setReferenceRule
            (*(IssueImpl **)(local_88._M_dataplus._M_p + 8),VARIABLE_ATTRIBUTE_REQUIRED);
  AnyCellmlElement::AnyCellmlElementImpl::setVariable
            ((AnyCellmlElementImpl *)
             **(undefined8 **)(*(long *)(local_88._M_dataplus._M_p + 8) + 0x28),variable);
  Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,(ulong)(local_138.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
  }
LAB_0023d7a5:
  if (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

void Parser::ParserImpl::loadVariable(const VariablePtr &variable, const XmlNodePtr &node)
{
    // A variable should not have any children.
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setVariable(variable);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' ignoring child element '" + childNode->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' has an invalid child element '" + childNode->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
    XmlAttributePtr attribute = node->firstAttribute();
    bool nameAttributePresent = false;
    bool unitsAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("name")) {
            variable->setName(attribute->value());
            nameAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            variable->setId(attribute->value());
        } else if (attribute->isType("units")) {
            if (mParsing1XVersion) {
                variable->setUnits(convertNonSiUnits(attribute->value()));
            } else {
                variable->setUnits(attribute->value());
            }
            unitsAttributePresent = true;
        } else if (attribute->isType("interface")) {
            variable->setInterfaceType(attribute->value());
        } else if (attribute->isType("initial_value")) {
            variable->setInitialValue(attribute->value());
        } else if (mParsing1XVersion && attribute->isType("public_interface")) {
            if (variable->hasInterfaceType(Variable::InterfaceType::PRIVATE)) {
                variable->setInterfaceType(Variable::InterfaceType::PUBLIC_AND_PRIVATE);
            } else {
                variable->setInterfaceType(Variable::InterfaceType::PUBLIC);
            }
        } else if (mParsing1XVersion && attribute->isType("private_interface")) {
            if (variable->hasInterfaceType(Variable::InterfaceType::PUBLIC)) {
                variable->setInterfaceType(Variable::InterfaceType::PUBLIC_AND_PRIVATE);
            } else {
                variable->setInterfaceType(Variable::InterfaceType::PRIVATE);
            }
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' ignoring attribute '" + attribute->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' has an invalid attribute '" + attribute->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_ATTRIBUTE_OPTIONAL);
            }
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!nameAttributePresent || !unitsAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        std::string description = "Variable ";
        if (nameAttributePresent) {
            description += "'" + node->attribute("name") + "' does not specify a units attribute.";
        } else if (unitsAttributePresent) {
            description += "with units '" + node->attribute("units") + "' does not specify a name attribute.";
        } else {
            description += "does not specify a name attribute or a units attribute.";
        }

        issue->mPimpl->setDescription(description);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_ATTRIBUTE_REQUIRED);
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        addIssue(issue);
    }
}